

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.cpp
# Opt level: O0

int __thiscall
TadsHttpServerThread::send_simple
          (TadsHttpServerThread *this,char *status_code,char *mime_type,char *msg_body,
          size_t msg_len,char *extra_headers)

{
  void *pvVar1;
  ssize_t sVar2;
  long in_RCX;
  size_t in_RDX;
  size_t in_RSI;
  TadsServerThread *in_RDI;
  int iVar3;
  void *in_R8;
  char *in_R9;
  char buf [200];
  char hdr [100];
  char local_178 [184];
  char local_a8 [112];
  char *local_38;
  void *local_30;
  long local_28;
  size_t local_20;
  int local_4;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  t3sprintf(local_a8,100,"HTTP/1.1 %s\r\n");
  iVar3 = (int)in_R8;
  pvVar1 = (void *)strlen(local_a8);
  sVar2 = TadsServerThread::send(in_RDI,(int)local_a8,pvVar1,in_RSI,iVar3);
  if ((int)sVar2 == 0) {
    local_4 = 0;
  }
  else {
    if (local_38 != (char *)0x0) {
      pvVar1 = (void *)strlen(local_38);
      TadsServerThread::send(in_RDI,(int)local_38,pvVar1,in_RSI,iVar3);
    }
    if (local_28 == 0) {
      sVar2 = TadsServerThread::send(in_RDI,0x3a9435,(void *)0x2,in_RSI,iVar3);
      if ((int)sVar2 == 0) {
        return 0;
      }
    }
    else {
      pvVar1 = local_30;
      t3sprintf(local_178,200,
                "Content-Type: %s\r\nContent-Length: %lu\r\nCache-control: no-cache\r\nConnection: Keep-Alive\r\n\r\n"
               );
      iVar3 = (int)pvVar1;
      pvVar1 = (void *)strlen(local_178);
      sVar2 = TadsServerThread::send(in_RDI,(int)local_178,pvVar1,local_20,iVar3);
      if (((int)sVar2 == 0) ||
         (sVar2 = TadsServerThread::send(in_RDI,(int)local_28,local_30,local_20,iVar3),
         (int)sVar2 == 0)) {
        return 0;
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int TadsHttpServerThread::send_simple(
    const char *status_code, const char *mime_type,
    const char *msg_body, size_t msg_len,
    const char *extra_headers)
{
    char hdr[100];

    /* send the response */
    t3sprintf(hdr, sizeof(hdr), "HTTP/1.1 %s\r\n", status_code);
    if (!send(hdr, strlen(hdr)))
        return FALSE;

    /* send the extra headers */
    if (extra_headers != 0)
        send(extra_headers, strlen(extra_headers));

    /* if there's a message body, send it, with a content-length header */
    if (msg_body != 0)
    {
        char buf[200];

        /* build the cache-control and content-length header */
        t3sprintf(buf, sizeof(buf),
                  "Content-Type: %s\r\n"
                  "Content-Length: %lu\r\n"
                  "Cache-control: no-cache\r\n"
                  "Connection: Keep-Alive\r\n"
                  "\r\n",
                  mime_type, (ulong)msg_len);

        /* send the headers, followed by the message body */
        if (!send(buf, strlen(buf))
            || !send(msg_body, msg_len))
            return FALSE;
    }
    else
    {
        /* 
         *   there's no body, so just send a blank line to mark the end of
         *   the header 
         */
        if (!send("\r\n", 2))
            return FALSE;
    }

    /* success */
    return TRUE;
}